

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_initCCtx(ZSTD_CCtx *cctx,ZSTD_customMem memManager)

{
  int iVar1;
  ZSTD_cpuid_t cpuid;
  size_t err;
  ZSTD_CCtx *cctx_local;
  
  memset(cctx,0,0x3d8);
  (cctx->customMem).customAlloc = memManager.customAlloc;
  (cctx->customMem).customFree = memManager.customFree;
  (cctx->customMem).opaque = memManager.opaque;
  cpuid = ZSTD_cpuid();
  iVar1 = ZSTD_cpuid_bmi2(cpuid);
  cctx->bmi2 = iVar1;
  ZSTD_CCtx_reset(cctx,ZSTD_reset_parameters);
  return;
}

Assistant:

static void ZSTD_initCCtx(ZSTD_CCtx* cctx, ZSTD_customMem memManager)
{
    assert(cctx != NULL);
    memset(cctx, 0, sizeof(*cctx));
    cctx->customMem = memManager;
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    {   size_t const err = ZSTD_CCtx_reset(cctx, ZSTD_reset_parameters);
        assert(!ZSTD_isError(err));
        (void)err;
    }
}